

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::ValidateProto3Field(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptorProto_const&)::__0,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  long lVar1;
  EnumDescriptor *pEVar2;
  AlphaNum local_118;
  AlphaNum local_e8;
  AlphaNum local_b8;
  AlphaNum local_88;
  AlphaNum local_58;
  
  local_58.piece_ = NullSafeStringView("Enum type \"");
  pEVar2 = google::protobuf::FieldDescriptor::enum_type((FieldDescriptor *)**(undefined8 **)this);
  local_88.piece_._M_str = (pEVar2->all_names_).payload_;
  local_88.piece_._M_len = (size_t)*(ushort *)(local_88.piece_._M_str + 2);
  local_88.piece_._M_str = local_88.piece_._M_str + ~local_88.piece_._M_len;
  local_b8.piece_ = NullSafeStringView("\" is not an open enum, but is used in \"");
  lVar1 = *(long *)(*(long *)(**(long **)this + 0x20) + 0x10);
  local_e8.piece_._M_len = (size_t)*(ushort *)(lVar1 + 2);
  local_e8.piece_._M_str = (char *)(~local_e8.piece_._M_len + lVar1);
  local_118.piece_ = NullSafeStringView("\" which is a proto3 message type.");
  StrCat<>(__return_storage_ptr__,&local_58,&local_88,&local_b8,&local_e8,&local_118);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}